

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O1

int cvLsDenseDQJac(realtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,CVodeMem cv_mem,N_Vector tmp1)

{
  long *plVar1;
  double dVar2;
  double dVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  N_Vector v;
  realtype *prVar7;
  realtype *prVar8;
  realtype *v_data;
  ulong uVar9;
  realtype rVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_a8;
  realtype *local_a0;
  
  pvVar4 = cv_mem->cv_lmem;
  uVar5 = SUNDenseMatrix_Columns(Jac);
  v = N_VCloneEmpty(tmp1);
  prVar7 = N_VGetArrayPointer(cv_mem->cv_ewt);
  prVar8 = N_VGetArrayPointer(y);
  if (cv_mem->cv_constraintsSet == 0) {
    local_a0 = (realtype *)0x0;
  }
  else {
    local_a0 = N_VGetArrayPointer(cv_mem->cv_constraints);
  }
  dVar11 = cv_mem->cv_uround;
  local_a8 = 0.0;
  if (0.0 < dVar11) {
    if (dVar11 < 0.0) {
      local_a8 = sqrt(dVar11);
    }
    else {
      local_a8 = SQRT(dVar11);
    }
  }
  rVar10 = N_VWrmsNorm(fy,cv_mem->cv_ewt);
  if ((rVar10 != 0.0) || (NAN(rVar10))) {
    dVar11 = rVar10 * (double)(int)uVar5 * ABS(cv_mem->cv_h) * 1000.0 * cv_mem->cv_uround;
  }
  else {
    dVar11 = 1.0;
  }
  if (0 < (int)uVar5) {
    uVar9 = 0;
    do {
      v_data = SUNDenseMatrix_Column(Jac,(sunindextype)uVar9);
      N_VSetArrayPointer(v_data,v);
      dVar2 = prVar8[uVar9];
      dVar13 = ABS(dVar2) * local_a8;
      if (ABS(dVar2) * local_a8 <= dVar11 / prVar7[uVar9]) {
        dVar13 = dVar11 / prVar7[uVar9];
      }
      if (cv_mem->cv_constraintsSet != 0) {
        dVar3 = local_a0[uVar9];
        dVar12 = ABS(dVar3);
        if ((dVar12 != 1.0) || (NAN(dVar12))) {
          if ((dVar12 == 2.0) && ((!NAN(dVar12) && ((dVar2 + dVar13) * dVar3 <= 0.0))))
          goto LAB_00436244;
        }
        else if ((dVar2 + dVar13) * dVar3 < 0.0) {
LAB_00436244:
          dVar13 = -dVar13;
        }
      }
      prVar8[uVar9] = dVar2 + dVar13;
      iVar6 = (*cv_mem->cv_f)(t,y,tmp1,cv_mem->cv_user_data);
      plVar1 = (long *)((long)pvVar4 + 0x90);
      *plVar1 = *plVar1 + 1;
      if (iVar6 != 0) goto LAB_004362d5;
      prVar8[uVar9] = dVar2;
      N_VLinearSum(1.0 / dVar13,tmp1,-(1.0 / dVar13),fy,v);
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  iVar6 = 0;
LAB_004362d5:
  N_VSetArrayPointer((realtype *)0x0,v);
  N_VDestroy(v);
  return iVar6;
}

Assistant:

int cvLsDenseDQJac(realtype t, N_Vector y, N_Vector fy,
                   SUNMatrix Jac, CVodeMem cv_mem, N_Vector tmp1)
{
  realtype fnorm, minInc, inc, inc_inv, yjsaved, srur, conj;
  realtype *y_data, *ewt_data, *cns_data;
  N_Vector ftemp, jthCol;
  sunindextype j, N;
  CVLsMem cvls_mem;
  int retval = 0;

  /* initialize cns_data to avoid compiler warning */
  cns_data = NULL;

  /* access LsMem interface structure */
  cvls_mem = (CVLsMem) cv_mem->cv_lmem;

  /* access matrix dimension */
  N = SUNDenseMatrix_Columns(Jac);

  /* Rename work vector for readibility */
  ftemp = tmp1;

  /* Create an empty vector for matrix column calculations */
  jthCol = N_VCloneEmpty(tmp1);

  /* Obtain pointers to the data for ewt, y */
  ewt_data = N_VGetArrayPointer(cv_mem->cv_ewt);
  y_data   = N_VGetArrayPointer(y);
  if (cv_mem->cv_constraintsSet)
    cns_data = N_VGetArrayPointer(cv_mem->cv_constraints);

  /* Set minimum increment based on uround and norm of f */
  srur = SUNRsqrt(cv_mem->cv_uround);
  fnorm = N_VWrmsNorm(fy, cv_mem->cv_ewt);
  minInc = (fnorm != ZERO) ?
    (MIN_INC_MULT * SUNRabs(cv_mem->cv_h) * cv_mem->cv_uround * N * fnorm) : ONE;

  for (j = 0; j < N; j++) {

    /* Generate the jth col of J(tn,y) */
    N_VSetArrayPointer(SUNDenseMatrix_Column(Jac,j), jthCol);

    yjsaved = y_data[j];
    inc = SUNMAX(srur*SUNRabs(yjsaved), minInc/ewt_data[j]);

    /* Adjust sign(inc) if y_j has an inequality constraint. */
    if (cv_mem->cv_constraintsSet) {
      conj = cns_data[j];
      if (SUNRabs(conj) == ONE)      {if ((yjsaved+inc)*conj < ZERO)  inc = -inc;}
      else if (SUNRabs(conj) == TWO) {if ((yjsaved+inc)*conj <= ZERO) inc = -inc;}
    }

    y_data[j] += inc;

    retval = cv_mem->cv_f(t, y, ftemp, cv_mem->cv_user_data);
    cvls_mem->nfeDQ++;
    if (retval != 0) break;

    y_data[j] = yjsaved;

    inc_inv = ONE/inc;
    N_VLinearSum(inc_inv, ftemp, -inc_inv, fy, jthCol);

  }

  /* Destroy jthCol vector */
  N_VSetArrayPointer(NULL, jthCol);  /* SHOULDN'T BE NEEDED */
  N_VDestroy(jthCol);

  return(retval);
}